

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_realtime_diagnoses.cc
# Opt level: O2

int __thiscall
aliyun::Rds::DescribeRealtimeDiagnoses
          (Rds *this,RdsDescribeRealtimeDiagnosesRequestType *req,
          RdsDescribeRealtimeDiagnosesResponseType *response,RdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  Value val;
  allocator<char> local_58c;
  allocator<char> local_58b;
  allocator<char> local_58a;
  allocator<char> local_589;
  undefined1 local_588 [32];
  _Alloc_hider local_568;
  size_type local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Alloc_hider local_548;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  RdsDescribeRealtimeDiagnosesResponseType *local_508;
  string str_response;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeRealtimeDiagnoses",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->db_instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"DBInstanceId",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->db_instance_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->start_time)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"StartTime",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->start_time);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((req->end_time)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"EndTime",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_3e0,(string *)&req->end_time);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"PageSize",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_420,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
  }
  if ((req->page_number)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"PageNumber",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_460,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"OwnerAccount",(allocator<char> *)local_588);
    std::__cxx11::string::string((string *)&local_4a0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"RegionId",(allocator<char> *)local_588);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_588,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_588,anon_var_dwarf_2e8ef7 + 9,&local_589);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_588);
        std::__cxx11::string::~string((string *)local_588);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_588,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_588,anon_var_dwarf_2e8ef7 + 9,&local_58a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_588);
        std::__cxx11::string::~string((string *)local_588);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_588,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_588,anon_var_dwarf_2e8ef7 + 9,&local_58b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_588);
        std::__cxx11::string::~string((string *)local_588);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_588,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_588,anon_var_dwarf_2e8ef7 + 9,&local_58c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_588);
        std::__cxx11::string::~string((string *)local_588);
      }
      if (response != (RdsDescribeRealtimeDiagnosesResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Engine");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Engine");
          Json::Value::asString_abi_cxx11_((string *)local_588,pVVar5);
          std::__cxx11::string::operator=((string *)&response->engine,(string *)local_588);
          std::__cxx11::string::~string((string *)local_588);
        }
        bVar1 = Json::Value::isMember(&val,"TotalRecordCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalRecordCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->total_record_count = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageNumber");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageNumber");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_number = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageRecordCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageRecordCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_record_count = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Tasks");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Tasks");
          bVar1 = Json::Value::isMember(pVVar5,"RealtimeDiagnoseTasks");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Tasks");
            pVVar5 = Json::Value::operator[](pVVar5,"RealtimeDiagnoseTasks");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              local_508 = response;
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_588._0_8_ = local_588 + 0x10;
                local_588._8_8_ = 0;
                local_588[0x10] = '\0';
                local_568._M_p = (pointer)&local_558;
                local_560 = 0;
                local_558._M_local_buf[0] = '\0';
                local_548._M_p = (pointer)&local_538;
                local_540 = 0;
                local_538._M_local_buf[0] = '\0';
                local_528._M_p = (pointer)&local_518;
                local_520 = 0;
                local_518._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"CreateTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"CreateTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)local_588,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"TaskId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"TaskId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_568,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"HealthScore");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"HealthScore");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_548,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Status");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"Status");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_528,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                std::
                vector<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType,_std::allocator<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>_>
                ::push_back(&local_508->tasks,(value_type *)local_588);
                RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType::
                ~RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType
                          ((RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *)local_588);
              }
            }
          }
        }
      }
      goto LAB_001806bf;
    }
  }
  iVar2 = -1;
  if (error_info != (RdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001806bf:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Rds::DescribeRealtimeDiagnoses(const RdsDescribeRealtimeDiagnosesRequestType& req,
                      RdsDescribeRealtimeDiagnosesResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeRealtimeDiagnoses");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.db_instance_id.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId", req.db_instance_id);
  }
  if(!req.start_time.empty()) {
    req_rpc->AddRequestQuery("StartTime", req.start_time);
  }
  if(!req.end_time.empty()) {
    req_rpc->AddRequestQuery("EndTime", req.end_time);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}